

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O0

void __thiscall cmComputeComponentGraph::TransferEdges(cmComputeComponentGraph *this)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *this_01;
  cmListFileBacktrace *__args_2;
  bool local_51;
  int local_50;
  int local_4c;
  int j_component;
  int j;
  cmGraphEdge *ni;
  const_iterator __end2;
  const_iterator __begin2;
  EdgeList *__range2;
  EdgeList *nl;
  int local_18;
  int i_component;
  int i;
  int n;
  cmComputeComponentGraph *this_local;
  
  sVar3 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                    (&this->InputGraph->
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  for (local_18 = 0; local_18 < (int)sVar3; local_18 = local_18 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->TarjanComponents,(long)local_18);
    iVar1 = *pvVar4;
    this_00 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                         (&this->InputGraph->
                           super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                          (long)local_18)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
    __end2 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_00);
    ni = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                  *)&ni);
      if (!bVar2) break;
      _j_component = __gnu_cxx::
                     __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                     ::operator*(&__end2);
      local_4c = cmGraphEdge::operator_cast_to_int(_j_component);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->TarjanComponents,(long)local_4c);
      local_50 = *pvVar4;
      if (iVar1 != local_50) {
        this_01 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                            (&(this->ComponentGraph).
                              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                             (long)iVar1);
        local_51 = cmGraphEdge::IsStrong(_j_component);
        __args_2 = cmGraphEdge::GetBacktrace(_j_component);
        std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
        emplace_back<int&,bool,cmListFileBacktrace_const&>(this_01,&local_50,&local_51,__args_2);
      }
      __gnu_cxx::
      __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void cmComputeComponentGraph::TransferEdges()
{
  // Map inter-component edges in the original graph to edges in the
  // component graph.
  int n = static_cast<int>(this->InputGraph.size());
  for (int i = 0; i < n; ++i) {
    int i_component = this->TarjanComponents[i];
    EdgeList const& nl = this->InputGraph[i];
    for (cmGraphEdge const& ni : nl) {
      int j = ni;
      int j_component = this->TarjanComponents[j];
      if (i_component != j_component) {
        // We do not attempt to combine duplicate edges, but instead
        // store the inter-component edges with suitable multiplicity.
        this->ComponentGraph[i_component].emplace_back(
          j_component, ni.IsStrong(), ni.GetBacktrace());
      }
    }
  }
}